

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSingleLumpFont::CreateFontFromPic(FSingleLumpFont *this,FTextureID picnum)

{
  FTexture *pFVar1;
  CharData *pCVar2;
  
  pFVar1 = TexMan.Textures.Array[picnum.texnum].Texture;
  (this->super_FFont).FontHeight = (uint)pFVar1->Height;
  (this->super_FFont).SpaceWidth = (uint)pFVar1->Width;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).FirstChar = 0x41;
  (this->super_FFont).LastChar = 0x41;
  pCVar2 = (CharData *)operator_new__(0x10);
  (this->super_FFont).Chars = pCVar2;
  pCVar2->Pic = pFVar1;
  (this->super_FFont).ActiveColors = 0;
  return;
}

Assistant:

void FSingleLumpFont::CreateFontFromPic (FTextureID picnum)
{
	FTexture *pic = TexMan[picnum];

	FontHeight = pic->GetHeight ();
	SpaceWidth = pic->GetWidth ();
	GlobalKerning = 0;

	FirstChar = LastChar = 'A';
	Chars = new CharData[1];
	Chars->Pic = pic;

	// Only one color range. Don't bother with the others.
	ActiveColors = 0;
}